

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int JS_DeleteProperty(JSContext *ctx,JSValue obj,JSAtom prop,int flags)

{
  int iVar1;
  JSStackFrame *pJVar2;
  int iVar3;
  JSStackFrame *sf;
  JSValueUnion p_00;
  JSRefCountHeader *p;
  JSValue v;
  
  v = JS_ToObject(ctx,obj);
  p_00 = v.u;
  iVar3 = -1;
  if ((uint)v.tag != 6) {
    iVar3 = delete_property(ctx,(JSObject *)p_00.ptr,prop);
    if ((0xfffffff4 < (uint)v.tag) && (iVar1 = *p_00.ptr, *(int *)p_00.ptr = iVar1 + -1, iVar1 < 2))
    {
      __JS_FreeValueRT(ctx->rt,v);
    }
    if (iVar3 == 0) {
      if (((uint)flags >> 0xe & 1) == 0) {
        if (-1 < (short)flags) {
          return 0;
        }
        pJVar2 = ctx->rt->current_stack_frame;
        if (pJVar2 == (JSStackFrame *)0x0) {
          return 0;
        }
        if ((pJVar2->js_mode & 1) == 0) {
          return 0;
        }
      }
      JS_ThrowTypeError(ctx,"could not delete property");
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

int JS_DeleteProperty(JSContext *ctx, JSValueConst obj, JSAtom prop, int flags)
{
    JSValue obj1;
    JSObject *p;
    int res;
    
    obj1 = JS_ToObject(ctx, obj);
    if (JS_IsException(obj1))
        return -1;
    p = JS_VALUE_GET_OBJ(obj1);
    res = delete_property(ctx, p, prop);
    JS_FreeValue(ctx, obj1);
    if (res != FALSE)
        return res;
    if ((flags & JS_PROP_THROW) ||
        ((flags & JS_PROP_THROW_STRICT) && is_strict_mode(ctx))) {
        JS_ThrowTypeError(ctx, "could not delete property");
        return -1;
    }
    return FALSE;
}